

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O3

int __thiscall
TMndxMarFile::LoadRootData
          (TMndxMarFile *this,FILE_MAR_INFO *MarInfo,LPBYTE pbRootFile,LPBYTE pbRootEnd)

{
  int iVar1;
  LPBYTE __dest;
  TFileNameDatabase *this_00;
  ulong __size;
  
  __size = (ulong)MarInfo->MarDataSize;
  __dest = (LPBYTE)malloc(__size);
  this->pbMarData = __dest;
  this->cbMarData = __size;
  if (__dest == (LPBYTE)0x0) {
    iVar1 = 0xc;
  }
  else {
    iVar1 = 0x3ec;
    if (pbRootFile + MarInfo->MarDataOffset + __size <= pbRootEnd) {
      memcpy(__dest,pbRootFile + MarInfo->MarDataOffset,__size);
      if (pbRootFile != (LPBYTE)0x0) {
        this_00 = (TFileNameDatabase *)operator_new(0x248);
        TFileNameDatabase::TFileNameDatabase(this_00);
        this->pDatabase = this_00;
        iVar1 = TFileNameDatabase::CreateDatabase(this_00,this->pbMarData,this->cbMarData);
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

int LoadRootData(FILE_MAR_INFO & MarInfo, LPBYTE pbRootFile, LPBYTE pbRootEnd)
    {
        // Allocate the MAR data
        pbMarData = CASC_ALLOC(BYTE, MarInfo.MarDataSize);
        cbMarData = MarInfo.MarDataSize;
        if(pbMarData == NULL)
            return ERROR_NOT_ENOUGH_MEMORY;

        // Capture the MAR data
        if(!CaptureData(pbRootFile + MarInfo.MarDataOffset, pbRootEnd, pbMarData, cbMarData))
            return ERROR_FILE_CORRUPT;

        // Create the file name database
        pDatabase = new TFileNameDatabase();
        if(pDatabase == NULL)
            return ERROR_NOT_ENOUGH_MEMORY;

        return pDatabase->CreateDatabase(pbMarData, cbMarData);
    }